

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O3

void read_key(EVP_PKEY **key,char *filename)

{
  FILE *fp;
  EVP_PKEY *pEVar1;
  
  fp = fopen(filename,"r");
  if (fp == (FILE *)0x0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
            ,0x151,"cannot open private key file %s",filename);
  }
  else {
    pEVar1 = PEM_read_PrivateKey(fp,(EVP_PKEY **)key,(undefined1 *)0x0,(void *)0x0);
    if (pEVar1 != (EVP_PKEY *)0x0) {
      fclose(fp);
      return;
    }
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
            ,0x155,"error while reading private key %s",filename);
    ERR_print_errors_fp(_stderr);
  }
  exit(0x5d);
}

Assistant:

void read_key(EVP_PKEY** key, char* filename) {
    FILE *file;
    // Read private key file
    if (fopen_s(&file, filename, "r")) {
        log_error("cannot open private key file %s", filename);
        exit (SCEP_PKISTATUS_FILE);
    }
    if (!PEM_read_PrivateKey(file, key, NULL, NULL)) {
        log_error("error while reading private key %s", filename);
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_FILE);
    }
    fclose(file);
}